

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMeshCache.cpp
# Opt level: O2

void __thiscall irr::scene::CMeshCache::addMesh(CMeshCache *this,path *filename,IAnimatedMesh *mesh)

{
  int *piVar1;
  MeshEntry e;
  MeshEntry local_60;
  
  piVar1 = (int *)(&(mesh->super_IMesh).field_0x10 + (long)(mesh->super_IMesh)._vptr_IMesh[-3]);
  *piVar1 = *piVar1 + 1;
  irr::io::SNamedPath::SNamedPath(&local_60.NamedPath,filename);
  local_60.Mesh = mesh;
  core::array<irr::scene::CMeshCache::MeshEntry>::push_back
            ((array<irr::scene::CMeshCache::MeshEntry> *)&(this->super_IMeshCache).field_0x8,
             &local_60);
  irr::io::SNamedPath::~SNamedPath(&local_60.NamedPath);
  return;
}

Assistant:

void CMeshCache::addMesh(const io::path &filename, IAnimatedMesh *mesh)
{
	mesh->grab();

	MeshEntry e(filename);
	e.Mesh = mesh;

	Meshes.push_back(e);
}